

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerHLSL::emit_access_chain(CompilerHLSL *this,Instruction *instruction)

{
  uint uVar1;
  bool bVar2;
  bool bVar3;
  uint32_t uVar4;
  uint uVar5;
  uint32_t *args;
  SPIRType *type_00;
  SPIRAccessChain *pSVar6;
  size_t sVar7;
  SPIRType *target_type;
  uint local_12c;
  uint local_114;
  TypedID<(spirv_cross::Types)0> local_110;
  uint32_t i_1;
  SPIRAccessChain *local_108;
  SPIRAccessChain *e;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  offsets;
  uint32_t uStack_d0;
  bool row_major_matrix;
  uint32_t array_stride;
  uint32_t matrix_stride;
  uint32_t i;
  SPIRType *basetype;
  string local_90;
  undefined1 local_70 [8];
  string base;
  SPIRVariable *backing_variable;
  uint32_t to_plain_buffer_length;
  uint32_t chain_arguments;
  SPIRAccessChain *chain;
  SPIRType *type;
  bool need_byte_access_chain;
  uint32_t length;
  uint32_t *ops;
  Instruction *instruction_local;
  CompilerHLSL *this_local;
  
  args = Compiler::stream((Compiler *)this,instruction);
  uVar1 = instruction->length;
  bVar3 = false;
  type_00 = Compiler::expression_type((Compiler *)this,args[2]);
  pSVar6 = Compiler::maybe_get<spirv_cross::SPIRAccessChain>((Compiler *)this,args[2]);
  if (pSVar6 == (SPIRAccessChain *)0x0) {
    if ((type_00->storage == StorageBuffer) ||
       (bVar2 = Compiler::has_decoration
                          ((Compiler *)this,(ID)(type_00->super_IVariant).self.id,BufferBlock),
       bVar2)) {
      sVar7 = VectorView<unsigned_int>::size(&(type_00->array).super_VectorView<unsigned_int>);
      bVar3 = sVar7 < uVar1 - 3;
    }
  }
  else {
    bVar3 = true;
  }
  if (bVar3) {
    if (pSVar6 == (SPIRAccessChain *)0x0) {
      sVar7 = VectorView<unsigned_int>::size(&(type_00->array).super_VectorView<unsigned_int>);
      local_12c = (uint)sVar7;
    }
    else {
      local_12c = 0;
    }
    base.field_2._8_8_ = Compiler::maybe_get_backing_variable((Compiler *)this,args[2]);
    if ((SPIRVariable *)base.field_2._8_8_ != (SPIRVariable *)0x0) {
      uVar4 = TypedID::operator_cast_to_unsigned_int
                        ((TypedID *)&(((SPIRVariable *)base.field_2._8_8_)->super_IVariant).self);
      uVar5 = (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x25])(this,(ulong)uVar4);
      if ((uVar5 & 1) != 0) {
        CompilerGLSL::emit_instruction(&this->super_CompilerGLSL,instruction);
        return;
      }
    }
    ::std::__cxx11::string::string((string *)local_70);
    if (local_12c == 0) {
      if (pSVar6 == (SPIRAccessChain *)0x0) {
        CompilerGLSL::to_expression_abi_cxx11_
                  ((string *)&basetype,&this->super_CompilerGLSL,args[2],true);
        ::std::__cxx11::string::operator=((string *)local_70,(string *)&basetype);
        ::std::__cxx11::string::~string((string *)&basetype);
      }
      else {
        ::std::__cxx11::string::operator=((string *)local_70,(string *)&pSVar6->base);
      }
    }
    else {
      uVar4 = args[2];
      target_type = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,*args);
      CompilerGLSL::access_chain_abi_cxx11_
                (&local_90,&this->super_CompilerGLSL,uVar4,args + 3,local_12c,target_type,
                 (AccessChainMeta *)0x0,false);
      ::std::__cxx11::string::operator=((string *)local_70,(string *)&local_90);
      ::std::__cxx11::string::~string((string *)&local_90);
    }
    _matrix_stride = Compiler::get_pointee_type((Compiler *)this,type_00);
    for (array_stride = 0; array_stride < local_12c; array_stride = array_stride + 1) {
      uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&_matrix_stride->parent_type);
      if (uVar4 == 0) {
        __assert_fail("basetype->parent_type",
                      "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Cross/spirv_hlsl.cpp"
                      ,0x140c,
                      "void spirv_cross::CompilerHLSL::emit_access_chain(const Instruction &)");
      }
      uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&_matrix_stride->parent_type);
      _matrix_stride = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar4);
    }
    uStack_d0 = 0;
    offsets._36_4_ = 0;
    offsets.second._3_1_ = 0;
    if (pSVar6 != (SPIRAccessChain *)0x0) {
      uStack_d0 = pSVar6->matrix_stride;
      offsets.second._3_1_ = pSVar6->row_major_matrix & 1;
      offsets._36_4_ = pSVar6->array_stride;
    }
    CompilerGLSL::flattened_access_chain_offset_abi_cxx11_
              ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
                *)&e,&this->super_CompilerGLSL,_matrix_stride,args + (local_12c + 3),
               (uVar1 - local_12c) - 3,0,1,(bool *)((long)&offsets.second + 3),
               &stack0xffffffffffffff30,(uint32_t *)&offsets.field_0x24,false);
    local_108 = Compiler::
                set<spirv_cross::SPIRAccessChain,unsigned_int_const&,spv::StorageClass_const&,std::__cxx11::string&,std::__cxx11::string&,unsigned_int&>
                          ((Compiler *)this,args[1],args,&type_00->storage,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_70,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&e,(uint *)(offsets.first.field_2._M_local_buf + 8));
    local_108->row_major_matrix = (bool)(offsets.second._3_1_ & 1);
    local_108->matrix_stride = uStack_d0;
    local_108->array_stride = offsets._36_4_;
    bVar3 = CompilerGLSL::should_forward(&this->super_CompilerGLSL,args[2]);
    local_108->immutable = bVar3;
    if (base.field_2._8_8_ == 0) {
      TypedID<(spirv_cross::Types)0>::TypedID(&local_110,0);
    }
    else {
      local_110.id = *(uint32_t *)(base.field_2._8_8_ + 8);
    }
    i_1 = (uint32_t)TypedID::operator_cast_to_TypedID((TypedID *)&local_110);
    (local_108->loaded_from).id = i_1;
    if (pSVar6 != (SPIRAccessChain *)0x0) {
      ::std::__cxx11::string::operator+=
                ((string *)&local_108->dynamic_index,(string *)&pSVar6->dynamic_index);
      local_108->static_index = pSVar6->static_index + local_108->static_index;
    }
    for (local_114 = 2; local_114 < uVar1; local_114 = local_114 + 1) {
      Compiler::inherit_expression_dependencies((Compiler *)this,args[1],args[local_114]);
      Compiler::add_implied_read_expression((Compiler *)this,local_108,args[local_114]);
    }
    ::std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
    ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
             *)&e);
    ::std::__cxx11::string::~string((string *)local_70);
  }
  else {
    CompilerGLSL::emit_instruction(&this->super_CompilerGLSL,instruction);
  }
  return;
}

Assistant:

void CompilerHLSL::emit_access_chain(const Instruction &instruction)
{
	auto ops = stream(instruction);
	uint32_t length = instruction.length;

	bool need_byte_access_chain = false;
	auto &type = expression_type(ops[2]);
	const auto *chain = maybe_get<SPIRAccessChain>(ops[2]);

	if (chain)
	{
		// Keep tacking on an existing access chain.
		need_byte_access_chain = true;
	}
	else if (type.storage == StorageClassStorageBuffer || has_decoration(type.self, DecorationBufferBlock))
	{
		// If we are starting to poke into an SSBO, we are dealing with ByteAddressBuffers, and we need
		// to emit SPIRAccessChain rather than a plain SPIRExpression.
		uint32_t chain_arguments = length - 3;
		if (chain_arguments > type.array.size())
			need_byte_access_chain = true;
	}

	if (need_byte_access_chain)
	{
		// If we have a chain variable, we are already inside the SSBO, and any array type will refer to arrays within a block,
		// and not array of SSBO.
		uint32_t to_plain_buffer_length = chain ? 0u : static_cast<uint32_t>(type.array.size());

		auto *backing_variable = maybe_get_backing_variable(ops[2]);

		if (backing_variable != nullptr && is_user_type_structured(backing_variable->self))
		{
			CompilerGLSL::emit_instruction(instruction);
			return;
		}

		string base;
		if (to_plain_buffer_length != 0)
			base = access_chain(ops[2], &ops[3], to_plain_buffer_length, get<SPIRType>(ops[0]));
		else if (chain)
			base = chain->base;
		else
			base = to_expression(ops[2]);

		// Start traversing type hierarchy at the proper non-pointer types.
		auto *basetype = &get_pointee_type(type);

		// Traverse the type hierarchy down to the actual buffer types.
		for (uint32_t i = 0; i < to_plain_buffer_length; i++)
		{
			assert(basetype->parent_type);
			basetype = &get<SPIRType>(basetype->parent_type);
		}

		uint32_t matrix_stride = 0;
		uint32_t array_stride = 0;
		bool row_major_matrix = false;

		// Inherit matrix information.
		if (chain)
		{
			matrix_stride = chain->matrix_stride;
			row_major_matrix = chain->row_major_matrix;
			array_stride = chain->array_stride;
		}

		auto offsets = flattened_access_chain_offset(*basetype, &ops[3 + to_plain_buffer_length],
		                                             length - 3 - to_plain_buffer_length, 0, 1, &row_major_matrix,
		                                             &matrix_stride, &array_stride);

		auto &e = set<SPIRAccessChain>(ops[1], ops[0], type.storage, base, offsets.first, offsets.second);
		e.row_major_matrix = row_major_matrix;
		e.matrix_stride = matrix_stride;
		e.array_stride = array_stride;
		e.immutable = should_forward(ops[2]);
		e.loaded_from = backing_variable ? backing_variable->self : ID(0);

		if (chain)
		{
			e.dynamic_index += chain->dynamic_index;
			e.static_index += chain->static_index;
		}

		for (uint32_t i = 2; i < length; i++)
		{
			inherit_expression_dependencies(ops[1], ops[i]);
			add_implied_read_expression(e, ops[i]);
		}
	}
	else
	{
		CompilerGLSL::emit_instruction(instruction);
	}
}